

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

void __thiscall
CommandLineArguments::addTestToRunBasedOnVerboseOutput
          (CommandLineArguments *this,int ac,char **av,int *index,char *parameterName)

{
  char lastExcludedChar;
  TestFilter *pTVar1;
  TestFilter *pTVar2;
  SimpleString testname;
  SimpleString wholename;
  SimpleString SStack_58;
  SimpleString local_48;
  
  SimpleString::SimpleString(&SStack_58,parameterName);
  getParameterField((CommandLineArguments *)&stack0xffffffffffffffc8,(int)parameterName,
                    (char **)(ulong)(uint)ac,(int *)av,(SimpleString *)index);
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::subStringFromTill(&SStack_58,(char)&stack0xffffffffffffffc8,',');
  SimpleString::subString(&local_48,(size_t)&SStack_58);
  SimpleString::operator=(&SStack_58,&local_48);
  SimpleString::~SimpleString(&local_48);
  pTVar1 = (TestFilter *)
           operator_new(0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                        ,0x15a);
  TestFilter::TestFilter(pTVar1,&SStack_58);
  pTVar2 = (TestFilter *)
           operator_new(0x20,
                        "/workspace/llm4binary/github/license_c_cmakelists/bneumann[P]CppUTest-Test-Adapter/build_O1/_deps/cpputest-src/src/CppUTest/CommandLineArguments.cpp"
                        ,0x15b);
  lastExcludedChar = SimpleString::at((SimpleString *)&stack0xffffffffffffffc8,0);
  SimpleString::subStringFromTill(&local_48,(char)&stack0xffffffffffffffc8,lastExcludedChar);
  TestFilter::TestFilter(pTVar2,&local_48);
  SimpleString::~SimpleString(&local_48);
  TestFilter::strictMatching(pTVar1);
  TestFilter::strictMatching(pTVar2);
  pTVar2 = TestFilter::add(pTVar2,this->groupFilters_);
  this->groupFilters_ = pTVar2;
  pTVar1 = TestFilter::add(pTVar1,this->nameFilters_);
  this->nameFilters_ = pTVar1;
  SimpleString::~SimpleString(&SStack_58);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

void CommandLineArguments::addTestToRunBasedOnVerboseOutput(int ac, const char *const *av, int& index, const char* parameterName)
{
    SimpleString wholename = getParameterField(ac, av, index, parameterName);
    SimpleString testname = wholename.subStringFromTill(',', ')');
    testname = testname.subString(2);
    TestFilter* namefilter = new TestFilter(testname);
    TestFilter* groupfilter = new TestFilter(wholename.subStringFromTill(wholename.at(0), ','));
    namefilter->strictMatching();
    groupfilter->strictMatching();
    groupFilters_ = groupfilter->add(groupFilters_);
    nameFilters_ = namefilter->add(nameFilters_);
}